

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O2

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory
          (DefaultShaderSourceStreamFactory *this,IReferenceCounters *pRefCounters,
          Char *SearchDirectories)

{
  char *pcVar1;
  char cVar2;
  _Alloc_hider in_RCX;
  char *pcVar3;
  String SearchPath;
  string local_50;
  
  ObjectBase<Diligent::IShaderSourceInputStreamFactory>::ObjectBase
            (&this->super_ObjectBase<Diligent::IShaderSourceInputStreamFactory>,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderSourceInputStreamFactory>).
  super_RefCountedObject<Diligent::IShaderSourceInputStreamFactory>.
  super_IShaderSourceInputStreamFactory.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_003d34e0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SearchDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (SearchDirectories != (Char *)0x0) {
    while (cVar2 = *SearchDirectories, pcVar3 = SearchDirectories, cVar2 != '\0') {
      while (cVar2 == ';') {
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
        cVar2 = *pcVar1;
      }
      SearchDirectories = pcVar3;
      if (cVar2 == '\0') break;
      do {
        pcVar1 = SearchDirectories + 1;
        SearchDirectories = SearchDirectories + 1;
        if (*pcVar1 == ';') break;
      } while (*pcVar1 != '\0');
      SearchPath._M_dataplus._M_p = (pointer)&SearchPath.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&SearchPath,pcVar3,SearchDirectories);
      if (SearchPath._M_string_length == 0) {
        FormatString<char[26],char[20]>
                  (&local_50,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"!SearchPath.empty()",(char (*) [20])in_RCX._M_p);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
                   ,0x3e);
        std::__cxx11::string::~string((string *)&local_50);
      }
      in_RCX._M_p = SearchPath._M_dataplus._M_p;
      if ((SearchPath._M_dataplus._M_p[SearchPath._M_string_length - 1] != '/') &&
         (SearchPath._M_dataplus._M_p[SearchPath._M_string_length - 1] != '\\')) {
        std::__cxx11::string::push_back((char)&SearchPath);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_SearchDirectories,&SearchPath);
      std::__cxx11::string::~string((string *)&SearchPath);
    }
  }
  std::__cxx11::string::string((string *)&SearchPath,"",(allocator *)&local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_SearchDirectories,&SearchPath);
  std::__cxx11::string::~string((string *)&SearchPath);
  return;
}

Assistant:

DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory(IReferenceCounters* pRefCounters, const Char* SearchDirectories) :
    ObjectBase<IShaderSourceInputStreamFactory>(pRefCounters)
{
    FileSystem::SplitPathList(SearchDirectories,
                              [&](const char* Path, size_t Len) //
                              {
                                  String SearchPath{Path, Len};
                                  VERIFY_EXPR(!SearchPath.empty());
                                  if (!FileSystem::IsSlash(SearchPath.back()))
                                      SearchPath.push_back(FileSystem::SlashSymbol);
                                  m_SearchDirectories.emplace_back(std::move(SearchPath));
                                  return true;
                              });
    m_SearchDirectories.push_back("");
}